

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_gui.c
# Opt level: O3

void pdgui_stub_vnew(t_pd *owner,char *destination,void *key,char *fmt,...)

{
  char in_AL;
  t_gfxstub *x;
  t_symbol *s;
  _gfxstub *p_Var1;
  t_symbol *fmt_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_138 [3];
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  p_Var1 = gfxstub_list;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  for (; p_Var1 != (t_gfxstub *)0x0; p_Var1 = p_Var1->x_next) {
    if (p_Var1->x_key == key) {
      gfxstub_deleteforkey(key);
    }
  }
  x = (t_gfxstub *)pd_new(gfxstub_class);
  sprintf((char *)local_138,".gfxstub%lx",x);
  s = gensym((char *)local_138);
  fmt_00 = s;
  pd_bind((t_pd *)x,s);
  x->x_owner = owner;
  x->x_sym = s;
  x->x_key = key;
  x->x_next = gfxstub_list;
  gfxstub_list = x;
  _pdguistub_vamess(destination,(char *)fmt_00,s->s_name);
  local_138[0].reg_save_area = local_e8;
  local_138[0].overflow_arg_area = &stack0x00000008;
  local_138[0].gp_offset = 0x20;
  local_138[0].fp_offset = 0x30;
  pdgui_vamess((char *)0x0,fmt,local_138);
  pdgui_endmess();
  return;
}

Assistant:

void pdgui_stub_vnew(t_pd *owner, const char* destination, void *key, const char* fmt, ...)
{
    t_symbol*s;
    t_gfxstub *x;
    va_list args;

        /* if any exists with matching key, burn it. */
    for (x = gfxstub_list; x; x = x->x_next)
        if (x->x_key == key)
            gfxstub_deleteforkey(key);
    x = (t_gfxstub *)pd_new(gfxstub_class);
    s = gfxstub_symbol(x);
    pd_bind(&x->x_pd, s);
    x->x_owner = owner;
    x->x_sym = s;
    x->x_key = key;
    x->x_next = gfxstub_list;
    gfxstub_list = x;

    _pdguistub_vamess(destination, "s", s->s_name);
    va_start(args, fmt);
    pdgui_vamess(0, fmt, args);
    va_end(args);
    pdgui_endmess();


}